

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gaussian_filter.hpp
# Opt level: O0

void MeanField::Filtering::applyGaussianKernel
               (float *kernel,float *input,float *output,float sd,int dim,int x,int y,int W,int H)

{
  float fVar1;
  float fVar2;
  undefined1 auVar3 [16];
  int iVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  void *pvVar8;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar10;
  double dVar9;
  int local_60;
  int local_5c;
  int i_2;
  int k;
  int j;
  int i_1;
  int idx_y;
  int idx_x;
  int sd_int;
  int i;
  float *channelSum;
  float factor;
  float normaliser;
  int y_local;
  int x_local;
  int dim_local;
  float sd_local;
  float *output_local;
  float *input_local;
  float *kernel_local;
  
  channelSum._4_4_ = 0.0;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (long)dim;
  uVar7 = SUB168(auVar3 * ZEXT816(4),0);
  if (SUB168(auVar3 * ZEXT816(4),8) != 0) {
    uVar7 = 0xffffffffffffffff;
  }
  pvVar8 = operator_new__(uVar7);
  uVar10 = extraout_XMM0_Db;
  for (idx_x = 0; idx_x < dim; idx_x = idx_x + 1) {
    uVar10 = 0;
    *(undefined4 *)((long)pvVar8 + (long)idx_x * 4) = 0;
  }
  iVar4 = (int)sd;
  for (k = -iVar4; k < iVar4; k = k + 1) {
    iVar5 = y + k;
    if ((-1 < iVar5) && (iVar5 < H)) {
      for (i_2 = -iVar4; i_2 < iVar4; i_2 = i_2 + 1) {
        iVar6 = x + i_2;
        if ((-1 < iVar6) && (iVar6 < W)) {
          dVar9 = std::fabs((double)CONCAT44(uVar10,(float)k));
          fVar1 = kernel[(int)SUB84(dVar9,0)];
          dVar9 = std::fabs((double)(ulong)(uint)(float)i_2);
          fVar2 = kernel[(int)SUB84(dVar9,0)];
          channelSum._4_4_ = fVar1 * fVar2 + channelSum._4_4_;
          for (local_5c = 0; uVar10 = 0, local_5c < dim; local_5c = local_5c + 1) {
            *(float *)((long)pvVar8 + (long)local_5c * 4) =
                 input[(iVar5 * W + iVar6) * dim + local_5c] * fVar1 * fVar2 +
                 *(float *)((long)pvVar8 + (long)local_5c * 4);
          }
        }
      }
    }
  }
  if (0.0 < channelSum._4_4_) {
    for (local_60 = 0; local_60 < dim; local_60 = local_60 + 1) {
      output[(y * W + x) * dim + local_60] =
           *(float *)((long)pvVar8 + (long)local_60 * 4) / channelSum._4_4_;
    }
  }
  if (pvVar8 != (void *)0x0) {
    operator_delete__(pvVar8);
  }
  return;
}

Assistant:

__SHARED_CODE__
            inline void applyGaussianKernel(const float *kernel, const float *input, float *output,
                float sd, int dim, int x, int y, int W, int H) {
            float normaliser = 0.0;
            float factor;
            float *channelSum = new float[dim];
            for (int i = 0; i < dim; i++) {
                channelSum[i] = 0.0;
            }

            int sd_int = (int)sd;
            int idx_x, idx_y;
            //Convolve for each channel.
            for (int i = -sd_int; i < sd_int; i++) {
                idx_y = y + i;
                if (idx_y < 0 || idx_y >= H) {
                    continue;
                }

                for (int j = -sd_int; j < sd_int; j++) {
                    idx_x = x + j;
                    if (idx_x < 0 || idx_x >= W) {
                        continue;
                    }
                    factor = kernel[(int)fabs((float)i)] * kernel[(int)fabs((float)j)];
                    normaliser += factor;

                    //Update cumulative output for each dimension/channel.
                    for (int k = 0; k < dim; k++) {
                        channelSum[k] += input[(idx_y*W + idx_x)*dim + k] * factor;
                    }
                }
            }

            //Normalise outputs.
            if (normaliser > 0.0) {
                for (int i = 0; i < dim; i++) {
                    output[(y*W + x)*dim + i] = channelSum[i] / normaliser;
                }
            }
            delete[] channelSum;
        }